

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall pegmatite::CharacterExpr::parse_non_term(CharacterExpr *this,Context *con)

{
  bool bVar1;
  Context *con_local;
  CharacterExpr *this_local;
  
  bVar1 = parseCharacter(con,this->character);
  return bVar1;
}

Assistant:

bool CharacterExpr::parse_non_term(Context &con) const
{
	return parseCharacter(con, character);
}